

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall
spdlog::details::registry::initialize_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  element_type *peVar1;
  element_type *peVar2;
  size_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar6;
  pointer psVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  level_enum *plVar10;
  pointer *__ptr;
  pointer psVar11;
  logger *__tmp;
  long *local_98;
  long *local_90;
  undefined1 local_88 [32];
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_> local_68
  ;
  _Any_data local_50;
  code *local_40;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  peVar1 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*((this->formatter_)._M_t.
     super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
     super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
     super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])(&local_98)
  ;
  psVar11 = (peVar1->sinks_).
            super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (peVar1->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar11 != psVar7) {
    do {
      peVar2 = (psVar11->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      psVar11 = psVar11 + 1;
      if (psVar11 == psVar7) {
        local_88._0_8_ = local_98;
        local_98 = (long *)0x0;
        (*peVar2->_vptr_sink[5])(peVar2);
        if ((long *)local_88._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_88._0_8_ + 8))();
        }
        break;
      }
      (**(code **)(*local_98 + 0x18))(&local_90);
      (*peVar2->_vptr_sink[5])(peVar2,&local_90);
      if (local_90 != (long *)0x0) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
      psVar7 = (peVar1->sinks_).
               super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (psVar11 != psVar7);
  }
  if (local_98 != (long *)0x0) {
    (**(code **)(*local_98 + 8))();
  }
  local_98 = (long *)0x0;
  if ((this->err_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    peVar1 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_50,&this->err_handler_);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&peVar1->custom_err_handler_,
                (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  iVar8 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->log_levels_)._M_h,
                 &((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->name_);
  plVar10 = (level_enum *)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                   ._M_cur + 0x28);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
      ._M_cur == (__node_type *)0x0) {
    plVar10 = &this->global_log_level_;
  }
  LOCK();
  (((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->level_).
  super___atomic_base<int>._M_i = *plVar10;
  UNLOCK();
  LOCK();
  (((new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
  flush_level_).super___atomic_base<int>._M_i = this->flush_level_;
  UNLOCK();
  sVar3 = this->backtrace_n_messages_;
  if (sVar3 != 0) {
    peVar1 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&peVar1->tracer_);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    (peVar1->tracer_).enabled_._M_base._M_i = true;
    local_88._0_8_ = sVar3 + 1;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    local_88._24_8_ = 0;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    vector(&local_68,local_88._0_8_,(allocator_type *)&local_90);
    circular_q<spdlog::details::log_msg_buffer>::copy_moveable
              (&(peVar1->tracer_).messages_,(circular_q<spdlog::details::log_msg_buffer> *)local_88)
    ;
    std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
    ~vector(&local_68);
    pthread_mutex_unlock((pthread_mutex_t *)&peVar1->tracer_);
  }
  if (this->automatic_registration_ == true) {
    peVar1 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (new_logger->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcVar5 = (peVar1->name_)._M_dataplus._M_p;
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar5,pcVar5 + (peVar1->name_)._M_string_length);
    throw_if_exists_(this,(string *)local_88);
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->loggers_,(key_type *)local_88);
    (pmVar9->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
    this_00 = (pmVar9->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (pmVar9->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         p_Var4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::initialize_logger(std::shared_ptr<logger> new_logger)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    new_logger->set_formatter(formatter_->clone());

    if (err_handler_)
    {
        new_logger->set_error_handler(err_handler_);
    }

    // set new level according to previously configured level or default level
    auto it = log_levels_.find(new_logger->name());
    auto new_level = it != log_levels_.end() ? it->second : global_log_level_;
    new_logger->set_level(new_level);

    new_logger->flush_on(flush_level_);

    if (backtrace_n_messages_ > 0)
    {
        new_logger->enable_backtrace(backtrace_n_messages_);
    }

    if (automatic_registration_)
    {
        register_logger_(std::move(new_logger));
    }
}